

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O1

void Cbs2_ObjCreateFanout(Cbs2_Man_t *p,int iObj,int iFan0,int iFan1)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  
  if (iObj < 0) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  if ((-1 < iFan0) && (iFan0 < (p->vFanout0).nSize)) {
    uVar3 = iObj * 2;
    uVar4 = (p->vFanoutN).nSize;
    if (uVar4 != uVar3 && SBORROW4(uVar4,uVar3) == (int)(uVar4 + iObj * -2) < 0) {
      piVar1 = (p->vFanout0).pArray;
      piVar2 = (p->vFanoutN).pArray;
      piVar2[uVar3] = piVar1[(uint)iFan0];
      if ((iFan1 < 0) || ((p->vFanout0).nSize <= iFan1)) goto LAB_007181e7;
      uVar4 = uVar3 | 1;
      if ((int)uVar4 < (p->vFanoutN).nSize) {
        piVar2[uVar4] = piVar1[(uint)iFan1];
        if ((iFan0 < (p->vFanout0).nSize) &&
           (piVar1[(uint)iFan0] = uVar3, iFan1 < (p->vFanout0).nSize)) {
          piVar1[(uint)iFan1] = uVar4;
          return;
        }
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
LAB_007181e7:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Cbs2_ObjCreateFanout( Cbs2_Man_t * p, int iObj, int iFan0, int iFan1 )
{
    Vec_IntWriteEntry( &p->vFanoutN, Abc_Var2Lit(iObj, 0), Vec_IntEntry(&p->vFanout0, iFan0) );
    Vec_IntWriteEntry( &p->vFanoutN, Abc_Var2Lit(iObj, 1), Vec_IntEntry(&p->vFanout0, iFan1) );
    Vec_IntWriteEntry( &p->vFanout0, iFan0, Abc_Var2Lit(iObj, 0) );
    Vec_IntWriteEntry( &p->vFanout0, iFan1, Abc_Var2Lit(iObj, 1) );
}